

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O0

void __thiscall FRemapTable::AddIndexRange(FRemapTable *this,int start,int end,int pal1,int pal2)

{
  byte bVar1;
  BYTE BVar2;
  uint uVar3;
  double dVar4;
  int k;
  int j;
  int i;
  double palstep;
  double palcol;
  int pal2_local;
  int pal1_local;
  int end_local;
  int start_local;
  FRemapTable *this_local;
  
  palcol._0_4_ = pal2;
  palcol._4_4_ = pal1;
  pal2_local = end;
  pal1_local = start;
  if (end < start) {
    _end_local = this;
    swapvalues<int>(&pal1_local,&pal2_local);
    swapvalues<int>((int *)((long)&palcol + 4),(int *)&palcol);
  }
  else if (start == end) {
    uVar3 = (uint)GPalette.Remap[start];
    bVar1 = GPalette.Remap[pal1];
    this->Remap[(int)uVar3] = bVar1;
    this->Palette[(int)uVar3].field_0 = GPalette.BaseColors[(int)(uint)bVar1].field_0;
    BVar2 = 0xff;
    if (uVar3 == 0) {
      BVar2 = '\0';
    }
    this->Palette[(int)uVar3].field_0.field_0.a = BVar2;
    return;
  }
  palstep = (double)palcol._4_4_;
  dVar4 = (double)palcol._0_4_ - palstep;
  for (k = pal1_local; k <= pal2_local; k = k + 1) {
    uVar3 = (uint)GPalette.Remap[k];
    bVar1 = GPalette.Remap[(int)palstep];
    this->Remap[(int)uVar3] = bVar1;
    this->Palette[(int)uVar3].field_0 = GPalette.BaseColors[(int)(uint)bVar1].field_0;
    BVar2 = 0xff;
    if (uVar3 == 0) {
      BVar2 = '\0';
    }
    this->Palette[(int)uVar3].field_0.field_0.a = BVar2;
    palstep = dVar4 / (double)(pal2_local - pal1_local) + palstep;
  }
  return;
}

Assistant:

void FRemapTable::AddIndexRange(int start, int end, int pal1, int pal2)
{
	double palcol, palstep;

	if (start > end)
	{
		swapvalues (start, end);
		swapvalues (pal1, pal2);
	}
	else if (start == end)
	{
		start = GPalette.Remap[start];
		pal1 = GPalette.Remap[pal1];
		Remap[start] = pal1;
		Palette[start] = GPalette.BaseColors[pal1];
		Palette[start].a = start == 0 ? 0 : 255;
		return;
	}
	palcol = pal1;
	palstep = (pal2 - palcol) / (end - start);
	for (int i = start; i <= end; palcol += palstep, ++i)
	{
		int j = GPalette.Remap[i], k = GPalette.Remap[int(palcol)];
		Remap[j] = k;
		Palette[j] = GPalette.BaseColors[k];
		Palette[j].a = j == 0 ? 0 : 255;
	}
}